

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

int pzshape::TPZShapeQuad::GetTransformId2dQ(TPZVec<long> *id)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  plVar1 = id->fStore;
  lVar2 = *plVar1;
  lVar3 = plVar1[1];
  lVar4 = plVar1[2];
  uVar7 = (ulong)(lVar4 < plVar1[3] ^ 3);
  if (plVar1[lVar3 <= lVar2] < plVar1[uVar7]) {
    uVar7 = (ulong)(lVar3 <= lVar2);
  }
  lVar6 = (long)(int)plVar1[uVar7];
  if (plVar1[(int)uVar7 + 1U & 3] < plVar1[(int)uVar7 - 1U & 3]) {
    if (lVar6 == lVar2) {
      return 0;
    }
    if (lVar6 == lVar3) {
      return 2;
    }
    if (lVar6 == lVar4) {
      return 4;
    }
    iVar5 = 6;
  }
  else {
    if (lVar6 == lVar2) {
      return 1;
    }
    if (lVar6 == lVar3) {
      return 3;
    }
    if (lVar6 == lVar4) {
      return 5;
    }
    iVar5 = 7;
  }
  if (lVar6 != plVar1[3]) {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}